

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

StatisticObject __thiscall Clasp::ProblemStats::at(ProblemStats *this,char *key)

{
  int iVar1;
  StatisticObject SVar2;
  
  iVar1 = strcmp(key,"vars");
  if (iVar1 != 0) {
    iVar1 = strcmp(key,"vars_eliminated");
    if (iVar1 == 0) {
      this = (ProblemStats *)&(this->vars).eliminated;
    }
    else {
      iVar1 = strcmp(key,"vars_frozen");
      if (iVar1 == 0) {
        this = (ProblemStats *)&(this->vars).frozen;
      }
      else {
        iVar1 = strcmp(key,"constraints");
        if (iVar1 == 0) {
          this = (ProblemStats *)&this->constraints;
        }
        else {
          iVar1 = strcmp(key,"constraints_binary");
          if (iVar1 == 0) {
            this = (ProblemStats *)&(this->constraints).binary;
          }
          else {
            iVar1 = strcmp(key,"constraints_ternary");
            if (iVar1 == 0) {
              this = (ProblemStats *)&(this->constraints).ternary;
            }
            else {
              iVar1 = strcmp(key,"acyc_edges");
              if (iVar1 == 0) {
                this = (ProblemStats *)&this->acycEdges;
              }
              else {
                iVar1 = strcmp(key,"complexity");
                if (iVar1 != 0) {
                  Potassco::fail(0x22,"StatisticObject Clasp::ProblemStats::at(const char *) const",
                                 0x39,"false",(char *)0x0);
                }
                this = (ProblemStats *)&this->complexity;
              }
            }
          }
        }
      }
    }
  }
  SVar2 = StatisticObject::value<unsigned_int,_&Clasp::_getValue>((uint *)this);
  return (StatisticObject)SVar2.handle_;
}

Assistant:

StatisticObject ProblemStats::at(const char* key) const {
#define VALUE(X) StatisticObject::value(&X)
#define APPLY(x, y) if (std::strcmp(key, #x) == 0) return y;
	PS_STATS(APPLY)
	POTASSCO_CHECK(false, ERANGE);
#undef VALUE
#undef APPLY
}